

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O3

int __thiscall IlmThread_3_2::Semaphore::value(Semaphore *this)

{
  int iVar1;
  int value;
  int local_34;
  long *local_30 [2];
  long local_20 [2];
  
  iVar1 = sem_getvalue((sem_t *)&this->_semaphore,&local_34);
  if (iVar1 != 0) {
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_30,"Cannot read semaphore value (%T).","");
    Iex_3_2::throwErrnoExc((string *)local_30);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return local_34;
}

Assistant:

int
Semaphore::value () const
{
    int value;

    if (::sem_getvalue (&_semaphore, &value))
        IEX_NAMESPACE::throwErrnoExc ("Cannot read semaphore value (%T).");

    return value;
}